

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deadline_timer_service.hpp
# Opt level: O0

void __thiscall
asio::detail::
deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>
::
async_wait<std::_Bind<void(*(std::shared_ptr<nuraft::delayed_task>,std::_Placeholder<1>))(std::shared_ptr<nuraft::delayed_task>&,std::error_code)>,asio::any_io_executor>
          (deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
           *this,implementation_type *impl,
          _Bind<void_(*(std::shared_ptr<nuraft::delayed_task>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::delayed_task>_&,_std::error_code)>
          *handler,any_io_executor *io_ex)

{
  bool bVar1;
  type queue;
  wait_handler<std::_Bind<void_(*(std::shared_ptr<nuraft::delayed_task>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::delayed_task>_&,_std::error_code)>,_asio::any_io_executor>
  *h;
  op_cancellation *poVar2;
  epoll_reactor *in_RCX;
  wait_op *in_RDX;
  long in_RSI;
  any_io_executor *in_RDI;
  ptr p;
  type slot;
  _Bind<void_(*(std::shared_ptr<nuraft::delayed_task>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::delayed_task>_&,_std::error_code)>
  *in_stack_ffffffffffffff98;
  wait_handler<std::_Bind<void_(*(std::shared_ptr<nuraft::delayed_task>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::delayed_task>_&,_std::error_code)>,_asio::any_io_executor>
  *in_stack_ffffffffffffffa0;
  wait_handler<std::_Bind<void_(*(std::shared_ptr<nuraft::delayed_task>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::delayed_task>_&,_std::error_code)>,_asio::any_io_executor>
  *timer;
  
  queue = get_associated_cancellation_slot<std::_Bind<void(*(std::shared_ptr<nuraft::delayed_task>,std::_Placeholder<1>))(std::shared_ptr<nuraft::delayed_task>&,std::error_code)>>
                    (in_stack_ffffffffffffff98);
  h = wait_handler<std::_Bind<void_(*(std::shared_ptr<nuraft::delayed_task>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::delayed_task>_&,_std::error_code)>,_asio::any_io_executor>
      ::ptr::allocate((_Bind<void_(*(std::shared_ptr<nuraft::delayed_task>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::delayed_task>_&,_std::error_code)>
                       *)in_stack_ffffffffffffffa0);
  timer = h;
  wait_handler<std::_Bind<void_(*(std::shared_ptr<nuraft::delayed_task>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::delayed_task>_&,_std::error_code)>,_asio::any_io_executor>
  ::wait_handler(in_stack_ffffffffffffffa0,
                 (_Bind<void_(*(std::shared_ptr<nuraft::delayed_task>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::delayed_task>_&,_std::error_code)>
                  *)h,in_RDI);
  bVar1 = cancellation_slot::is_connected((cancellation_slot *)&stack0xffffffffffffffd8);
  if (bVar1) {
    poVar2 = cancellation_slot::
             emplace<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>::op_cancellation,asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>*,asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>::per_timer_data*>
                       ((cancellation_slot *)h,
                        (deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
                         **)timer,(per_timer_data **)in_RDX);
    (h->super_wait_op).cancellation_key_ = poVar2;
  }
  *(undefined1 *)(in_RSI + 8) = 1;
  epoll_reactor::
  schedule_timer<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>
            (in_RCX,(timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
                     *)queue.handler_,(time_type *)h,(per_timer_data *)timer,in_RDX);
  wait_handler<std::_Bind<void_(*(std::shared_ptr<nuraft::delayed_task>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::delayed_task>_&,_std::error_code)>,_asio::any_io_executor>
  ::ptr::~ptr((ptr *)0x25039d);
  return;
}

Assistant:

void async_wait(implementation_type& impl,
      Handler& handler, const IoExecutor& io_ex)
  {
    typename associated_cancellation_slot<Handler>::type slot
      = asio::get_associated_cancellation_slot(handler);

    // Allocate and construct an operation to wrap the handler.
    typedef wait_handler<Handler, IoExecutor> op;
    typename op::ptr p = { asio::detail::addressof(handler),
      op::ptr::allocate(handler), 0 };
    p.p = new (p.v) op(handler, io_ex);

    // Optionally register for per-operation cancellation.
    if (slot.is_connected())
    {
      p.p->cancellation_key_ =
        &slot.template emplace<op_cancellation>(this, &impl.timer_data);
    }

    impl.might_have_pending_waits = true;

    ASIO_HANDLER_CREATION((scheduler_.context(),
          *p.p, "deadline_timer", &impl, 0, "async_wait"));

    scheduler_.schedule_timer(timer_queue_, impl.expiry, impl.timer_data, p.p);
    p.v = p.p = 0;
  }